

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment.h
# Opt level: O0

string * __thiscall Comment::toString_abi_cxx11_(Comment *this)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  char *in_stack_00000050;
  ResponseBase *in_stack_00000058;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000060;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000068;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000070;
  undefined1 in_stack_00000078 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  char *in_stack_fffffffffffffe98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffea0;
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [64];
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ResponseBase::attribute<bool>(in_stack_00000058,in_stack_00000050,(bool *)in_stack_00000048);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ResponseBase::attribute<unsigned_long>
            (in_stack_00000058,in_stack_00000050,(unsigned_long *)in_stack_00000048);
  ResponseBase::attribute<std::__cxx11::string>
            (in_stack_00000058,in_stack_00000050,in_stack_00000048);
  ::str::
  concat<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            ((string_view)in_stack_00000078,in_stack_00000070,in_stack_00000068,in_stack_00000060,
             in_stack_000000a0,in_stack_000000a8,in_stack_000000b0,in_stack_000000b8,
             in_stack_000000c0);
  std::__cxx11::string::~string(local_130);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::~string(local_f0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_40);
  return in_RDI;
}

Assistant:

std::string toString() const {
			return str::concat("\n",
					attribute("author", author),
					attribute("isTopLevelComment", isTopLevelComment),
					attribute("id", id),
					attribute("parentId", parentId),
					attribute("threadId", threadId),
					attribute("link", link),
					attribute("created", created),
					attribute("body", body));
		}